

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O3

void __thiscall UDUNITS_acceptedNameSymbols_Test::TestBody(UDUNITS_acceptedNameSymbols_Test *this)

{
  char cVar1;
  bool bVar2;
  XMLError XVar3;
  XMLElement *pXVar4;
  XMLElement *pXVar5;
  char *pcVar6;
  uint64_t uVar7;
  ulong uVar8;
  ostream *poVar9;
  size_t sVar10;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  int iVar11;
  pointer *__ptr_2;
  undefined4 uVar12;
  float fVar13;
  undefined4 uVar14;
  precise_unit pVar15;
  int failConvert;
  string def;
  XMLDocument doc;
  unit local_3e8;
  AssertHelper local_3e0;
  unit local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  undefined1 local_3c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  double local_3a8;
  XMLElement *local_3a0;
  string local_398;
  string local_378;
  string local_358;
  XMLDocument local_338;
  
  tinyxml2::XMLDocument::XMLDocument(&local_338,true,PRESERVE_WHITESPACE);
  XVar3 = tinyxml2::XMLDocument::LoadFile
                    (&local_338,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UDUNITS2/udunits2-accepted.xml"
                    );
  local_3d8.multiplier_._0_1_ = XVar3 == XML_SUCCESS;
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (XVar3 == XML_SUCCESS) {
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&local_338.super_XMLNode,"unit-system");
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"unit");
    local_3e0.data_._0_4_ = 0;
    if (pXVar4 != (XMLElement *)0x0) {
      iVar11 = 0;
      do {
        pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"def");
        pcVar6 = tinyxml2::XMLNode::Value((pXVar5->super_XMLNode)._firstChild);
        std::__cxx11::string::string((string *)local_3c8,pcVar6,(allocator *)&local_3d8);
        local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,CONCAT71(local_3c8._1_7_,local_3c8[0]),
                   (long)&(local_3c0->_M_dataplus)._M_p + CONCAT71(local_3c8._1_7_,local_3c8[0]));
        uVar7 = units::getDefaultFlags();
        pVar15 = units::unit_from_string(&local_398,uVar7);
        uVar8 = pVar15._8_8_;
        local_3a8 = pVar15.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
        }
        if ((uVar8 & 0xffffffff) == 0xfa94a488 || NAN(local_3a8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"unable to convert ",0x12);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)CONCAT71(local_3c8._1_7_,local_3c8[0]),
                              (long)local_3c0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," into a valid unit \n",0x14);
          iVar11 = iVar11 + 1;
          local_3e0.data_._0_4_ = iVar11;
        }
        else {
          pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"name");
          if (pXVar5 != (XMLElement *)0x0) {
            pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar5->super_XMLNode,"singular");
            pcVar6 = tinyxml2::XMLNode::Value((pXVar5->super_XMLNode)._firstChild);
            std::__cxx11::string::string((string *)&local_358,pcVar6,(allocator *)&local_3d8);
            uVar7 = units::getDefaultFlags();
            pVar15 = units::unit_from_string(&local_358,uVar7);
            uVar12 = pVar15.multiplier_._0_4_;
            uVar14 = pVar15.multiplier_._4_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              local_3a0 = (XMLElement *)pVar15.multiplier_;
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
              uVar12 = SUB84(local_3a0,0);
              uVar14 = (undefined4)((ulong)local_3a0 >> 0x20);
            }
            if ((pVar15._8_8_ & 0xffffffff) == 0xfa94a488 ||
                (NAN((double)CONCAT44(uVar14,uVar12)) || NAN((double)CONCAT44(uVar14,uVar12)))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"unable to convert ",0x12);
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1bf430);
              }
              else {
                sVar10 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar6,sVar10);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," into a valid unit \n",0x14);
            }
            else {
              local_3d8 = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar14,uVar12) |
                                pVar15._8_8_ << 0x20);
              local_3e8 = (unit)((ulong)(uint)(float)local_3a8 | uVar8 << 0x20);
              bVar2 = units::unit::operator==(&local_3d8,&local_3e8);
              if (bVar2) goto LAB_00129ae0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"name and unit do not match ",0x1b);
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1bf430);
              }
              else {
                sVar10 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar6,sVar10);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,
                                  (char *)CONCAT71(local_3c8._1_7_,local_3c8[0]),(long)local_3c0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            }
            iVar11 = iVar11 + 1;
            local_3e0.data_._0_4_ = iVar11;
          }
LAB_00129ae0:
          local_3a0 = pXVar4;
          pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"symbol");
          fVar13 = (float)local_3a8;
          for (; pXVar4 = local_3a0, pXVar5 != (XMLElement *)0x0;
              pXVar5 = tinyxml2::XMLNode::NextSiblingElement(&pXVar5->super_XMLNode,"symbol")) {
            pcVar6 = tinyxml2::XMLNode::Value((pXVar5->super_XMLNode)._firstChild);
            std::__cxx11::string::string((string *)&local_378,pcVar6,(allocator *)&local_3d8);
            uVar7 = units::getDefaultFlags();
            pVar15 = units::unit_from_string(&local_378,uVar7);
            uVar12 = pVar15.multiplier_._0_4_;
            uVar14 = pVar15.multiplier_._4_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              local_3a8 = pVar15.multiplier_;
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
              uVar12 = SUB84(local_3a8,0);
              uVar14 = (undefined4)((ulong)local_3a8 >> 0x20);
            }
            if ((pVar15._8_8_ & 0xffffffff) == 0xfa94a488 ||
                (NAN((double)CONCAT44(uVar14,uVar12)) || NAN((double)CONCAT44(uVar14,uVar12)))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"unable to convert ",0x12);
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1bf430);
              }
              else {
                sVar10 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar6,sVar10);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," into a valid unit \n",0x14);
LAB_00129ca1:
              iVar11 = iVar11 + 1;
              local_3e0.data_._0_4_ = iVar11;
            }
            else {
              local_3d8 = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar14,uVar12) |
                                pVar15._8_8_ << 0x20);
              local_3e8 = (unit)((ulong)(uint)fVar13 | uVar8 << 0x20);
              bVar2 = units::unit::operator==(&local_3d8,&local_3e8);
              if (!bVar2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"symbol and unit do not match ",0x1d);
                if (pcVar6 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1bf430);
                }
                else {
                  sVar10 = strlen(pcVar6);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pcVar6,sVar10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (char *)CONCAT71(local_3c8._1_7_,local_3c8[0]),(long)local_3c0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                goto LAB_00129ca1;
              }
            }
          }
        }
        pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"unit");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_3c8._1_7_,local_3c8[0]) != &local_3b8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_3c8._1_7_,local_3c8[0]),
                          local_3b8._M_allocated_capacity + 1);
        }
      } while (pXVar4 != (XMLElement *)0x0);
    }
    local_3d8 = (unit)((ulong)local_3d8 & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_3c8,"failConvert","0",(int *)&local_3e0,(int *)&local_3d8);
    if (local_3c8[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_3d8);
      if (local_3c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_3c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
                 ,0x48,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3e8,(Message *)&local_3d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3e8);
      if (local_3d8 != (unit)0x0) {
        (**(code **)(*(long *)local_3d8 + 8))();
      }
    }
    if (local_3c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00129d9e;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3c0;
  }
  else {
    testing::Message::Message((Message *)&local_3e8);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3d0;
    std::ostream::operator<<((ostream *)((long)local_3e8 + 0x10),XVar3);
    cVar1 = local_3e8.multiplier_._0_1_ + '\x10';
    std::ios::widen((char)*(undefined8 *)(*(long *)((long)local_3e8 + 0x10) + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3c8,(internal *)&local_3d8,(AssertionResult *)0x17f8e8,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
               ,0x17,(char *)CONCAT71(local_3c8._1_7_,local_3c8[0]));
    testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_3c8._1_7_,local_3c8[0]) != &local_3b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._M_allocated_capacity + 1)
      ;
    }
    if (local_3e8 != (unit)0x0) {
      (**(code **)(*(long *)local_3e8 + 8))();
    }
    local_3c0 = local_3d0;
    if (local_3d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00129d9e;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_3c0);
LAB_00129d9e:
  tinyxml2::XMLDocument::~XMLDocument(&local_338);
  return;
}

Assistant:

TEST(UDUNITS, acceptedNameSymbols)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-accepted.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert = 0;
    while (cs != nullptr) {
        std::string def = cs->FirstChildElement("def")->FirstChild()->Value();

        auto definitionUnit = units::unit_from_string(def);
        if (is_error(definitionUnit)) {
            std::cout << "unable to convert " << def << " into a valid unit \n";
            ++failConvert;
        } else {
            auto name = cs->FirstChildElement("name");
            if (name != nullptr) {
                auto sname =
                    name->FirstChildElement("singular")->FirstChild()->Value();
                auto nameUnit = units::unit_from_string(sname);
                if (is_error(nameUnit)) {
                    std::cout << "unable to convert " << sname
                              << " into a valid unit \n";
                    ++failConvert;
                } else {
                    if (unit_cast(nameUnit) != unit_cast(definitionUnit)) {
                        std::cout << "name and unit do not match " << sname
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            // check for symbols
            auto sym = cs->FirstChildElement("symbol");
            while (sym != nullptr) {
                auto symString = sym->FirstChild()->Value();
                auto symUnit = units::unit_from_string(symString);
                if (is_error(symUnit)) {
                    std::cout << "unable to convert " << symString
                              << " into a valid unit \n";
                    ++failConvert;
                } else {
                    if (unit_cast(symUnit) != unit_cast(definitionUnit)) {
                        std::cout << "symbol and unit do not match "
                                  << symString << " and " << def << "\n";
                        ++failConvert;
                    }
                }
                sym = sym->NextSiblingElement("symbol");
            }
        }
        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}